

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

string * libcellml::formDescriptionOfCyclicDependency
                   (string *__return_storage_ptr__,History *history,string *action)

{
  pointer psVar1;
  string *psVar2;
  bool bVar3;
  long lVar4;
  char *__s;
  ulong uVar5;
  HistoryEpochPtr h;
  string msgHistory;
  ModelPtr model;
  value_type origin;
  string msgHeader;
  string typeStringPrefix;
  __shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  History *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string *local_1a8;
  long local_1a0;
  ulong local_198;
  __shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> local_190;
  __shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2> local_180;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1d0 = history;
  std::__shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_180,
             &((history->
               super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
               )._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_190,
             &((local_180._M_ptr)->mSourceModel).
              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>);
  bVar3 = std::operator==(&(local_180._M_ptr)->mType,"component");
  __s = "";
  if (bVar3) {
    __s = "a ";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,__s,(allocator<char> *)&local_b0);
  std::operator+(&local_f0,"Cyclic dependencies were found when attempting to ",action);
  std::operator+(&local_150,&local_f0," ");
  std::operator+(&local_130,&local_150,&local_70);
  std::operator+(&local_d0,&local_130,&(local_180._M_ptr)->mType);
  std::operator+(&local_110,&local_d0," in the model \'");
  NamedEntity::name_abi_cxx11_(&local_170,(NamedEntity *)local_190._M_ptr);
  std::operator+(&local_1c8,&local_110,&local_170);
  local_1a8 = __return_storage_ptr__;
  std::operator+(&local_b0,&local_1c8,"\'. The dependency loop is:\n");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_f0);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1e8._M_ptr = (element_type *)0x0;
  local_1e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  lVar4 = 0;
  uVar5 = 0;
  while( true ) {
    psVar2 = local_1a8;
    psVar1 = (local_1d0->
             super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_1d0->
                      super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar5)
    break;
    local_198 = uVar5;
    std::__shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_1e8,
               (__shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(psVar1->
                       super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + lVar4));
    std::operator+(&local_90," - ",&(local_1e8._M_ptr)->mType);
    local_1a0 = lVar4;
    std::operator+(&local_50,&local_90," \'");
    std::operator+(&local_170,&local_50,&(local_1e8._M_ptr)->mName);
    std::operator+(&local_f0,&local_170,"\' specifies an import from \'");
    std::operator+(&local_150,&local_f0,&(local_1e8._M_ptr)->mSourceUrl);
    std::operator+(&local_130,&local_150,"\' to \'");
    std::operator+(&local_d0,&local_130,&(local_1e8._M_ptr)->mDestinationUrl);
    std::operator+(&local_110,&local_d0,"\'");
    std::__cxx11::string::append((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    uVar5 = local_198;
    std::__cxx11::string::append((char *)&local_1c8);
    uVar5 = uVar5 + 1;
    lVar4 = local_1a0 + 0x10;
  }
  std::operator+(local_1a8,&local_b0,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_180._M_refcount);
  return psVar2;
}

Assistant:

std::string formDescriptionOfCyclicDependency(const History &history, const std::string &action)
{
    auto origin = history.front();
    auto model = origin->mSourceModel;
    bool isComponent = origin->mType == "component";
    std::string typeStringPrefix = isComponent ? "a " : "";
    std::string msgHeader = "Cyclic dependencies were found when attempting to " + action + " "
                            + typeStringPrefix + origin->mType + " in the model '"
                            + model->name() + "'. The dependency loop is:\n";
    HistoryEpochPtr h;
    size_t i = 0;
    std::string msgHistory;
    while (i < history.size()) {
        h = history[i];
        msgHistory += " - " + h->mType + " '" + h->mName + "' specifies an import from '" + h->mSourceUrl + "' to '" + h->mDestinationUrl + "'";
        if (i == history.size() - 2) {
            msgHistory += "; and\n";
        } else if (i == history.size() - 1) {
            msgHistory += ".";
        } else {
            msgHistory += ";\n";
        }
        ++i;
    }

    return msgHeader + msgHistory;
}